

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O3

char * unparse_token(Token *t,char *buf)

{
  TokenType TVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  
  TVar1 = t->type;
  if (0x3a < (int)TVar1) {
    if (TVar1 == TOK_DEREF) {
      uVar2 = (ulong)(t->u).reginfo.size;
      if (uVar2 == 0) {
        builtin_strncpy(buf,"deref",6);
        return buf;
      }
      pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][uVar2];
      pcVar4 = "deref%s";
    }
    else {
      if (TVar1 != TOK_SWAP) {
        if (TVar1 == TOK_EMPTY) {
          builtin_strncpy(buf,"[EMPTY]",8);
          return buf;
        }
        goto switchD_00106432_caseD_17;
      }
      pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
      pcVar4 = "swap%s";
    }
    goto LAB_001066a6;
  }
  switch(TVar1) {
  case TOK_DOLLAR_DATA_REGISTER:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "$%d.d%s";
    break;
  case TOK_DOLLAR_ADDRESS_REGISTER:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "$%d.a%s";
    break;
  case TOK_DOLLAR_GENERAL_REGISTER:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "$%d.g%s";
    break;
  case TOK_DOLLAR_AMODE:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "$%d.m%s";
    break;
  case TOK_DOLLAR_REVERSED_AMODE:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "$%d.r%s";
    break;
  case TOK_DOLLAR_NUMBER:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "$%d.%s";
    break;
  case TOK_DOLLAR_AMODE_PTR:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "$%d.p%s";
    break;
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "$%d.q%s";
    break;
  default:
switchD_00106432_caseD_17:
    pcVar3 = strcpy(buf,(t->u).string);
    return pcVar3;
  case TOK_QUOTED_STRING:
    pcVar3 = (t->u).string;
    pcVar4 = "\"%s\"";
    goto LAB_001066a6;
  case TOK_NUMBER:
    pcVar3 = (t->u).string;
    pcVar4 = "%ld";
LAB_001066a6:
    sprintf(buf,pcVar4,pcVar3);
    return buf;
  case TOK_DATA_REGISTER:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "d%d.%s";
    break;
  case TOK_ADDRESS_REGISTER:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "a%d.%s";
    break;
  case TOK_TEMP_REGISTER:
    uVar2 = (ulong)(t->u).reginfo.which;
    pcVar3 = unparse_token::regdesc[(t->u).reginfo.sgnd][(t->u).reginfo.size];
    pcVar4 = "tmp%d.%s";
  }
  sprintf(buf,pcVar4,uVar2,pcVar3);
  return buf;
}

Assistant:

char *
unparse_token (const Token *t, char *buf)
{
  static const char *regdesc[2][5] = {
    { "", "ub", "uw",  "", "ul" },
    { "", "sb", "sw",  "", "sl" }
  };

  switch (t->type) {
  case TOK_NUMBER:
    sprintf (buf, "%ld", t->u.n);
    break;
  case TOK_QUOTED_STRING:
    sprintf (buf, "\"%s\"", t->u.string);
    break;
  case TOK_EMPTY:
    strcpy (buf, "[EMPTY]");
    break;
  case TOK_DEREF:
    if (t->u.derefinfo.size == 0)
      strcpy (buf, "deref");
    else sprintf (buf, "deref%s",
		  regdesc[t->u.derefinfo.sgnd][t->u.derefinfo.size]);
    break;
  case TOK_SWAP:
    sprintf (buf, "swap%s", regdesc[t->u.derefinfo.sgnd][t->u.derefinfo.size]);
    break;
  case TOK_DATA_REGISTER:
    sprintf (buf, "d%d.%s", t->u.reginfo.which,
	     regdesc[t->u.reginfo.sgnd][t->u.reginfo.size]);
    break;
  case TOK_ADDRESS_REGISTER:
    sprintf (buf, "a%d.%s", t->u.reginfo.which,
	     regdesc[t->u.reginfo.sgnd][t->u.reginfo.size]);
    break;
  case TOK_TEMP_REGISTER:
    sprintf (buf, "tmp%d.%s", t->u.reginfo.which,
	     regdesc[t->u.reginfo.sgnd][t->u.reginfo.size]);
    break;
  case TOK_DOLLAR_DATA_REGISTER:
    sprintf (buf, "$%d.d%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_ADDRESS_REGISTER:
    sprintf (buf, "$%d.a%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_GENERAL_REGISTER:
    sprintf (buf, "$%d.g%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_AMODE:
    sprintf (buf, "$%d.m%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_REVERSED_AMODE:
    sprintf (buf, "$%d.r%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_AMODE_PTR:
    sprintf (buf, "$%d.p%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    sprintf (buf, "$%d.q%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  case TOK_DOLLAR_NUMBER:
    sprintf (buf, "$%d.%s", t->u.dollarinfo.which,
	     regdesc[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    break;
  default:
    strcpy (buf, t->u.string);
    break;
  }

  return buf;
}